

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

void __thiscall djb::tab_r::extract_ndf(tab_r *this,brdf *brdf,int res)

{
  vector<float,_std::allocator<float>_> *this_00;
  ulong __n;
  ulong uVar1;
  iterator iVar2;
  pointer pfVar3;
  double dVar4;
  pointer pvVar5;
  tab_r *ptVar6;
  float *__dest;
  long lVar7;
  ulong uVar8;
  int j;
  int k;
  int iVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  vector<double,_std::allocator<double>_> v;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> frp_v;
  vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_> io;
  matrix km;
  undefined1 local_108 [12];
  float fStack_fc;
  pointer local_f8;
  float local_e4;
  brdf *local_e0;
  float local_d4;
  float local_d0;
  float local_cc;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> local_c8;
  void *local_a8;
  iterator iStack_a0;
  pair<djb::vec3,_djb::vec3> *local_98;
  ulong local_90;
  tab_r *local_88;
  ulong local_80;
  double local_78;
  double local_70;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> local_68;
  matrix local_50;
  
  uVar10 = res - 1;
  local_108._0_8_ = (pointer)0x0;
  local_e0 = brdf;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_50.mij,(ulong)(uVar10 * uVar10),(value_type_conflict2 *)local_108,
             (allocator_type *)&local_a8);
  local_98 = (pair<djb::vec3,_djb::vec3> *)0x0;
  local_a8 = (void *)0x0;
  iStack_a0._M_current = (pair<djb::vec3,_djb::vec3> *)0x0;
  local_c8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.size = uVar10;
  if (1 < res) {
    uVar11 = 0;
    do {
      fVar12 = ((float)(int)uVar11 / (float)(int)uVar10) * ((float)(int)uVar11 / (float)(int)uVar10)
               * 3.1415927 * 0.5;
      fVar13 = cosf(fVar12);
      local_108._0_4_ = sinf(fVar12);
      local_108._4_4_ = 0;
      stack0xffffffffffffff00 = (pointer)CONCAT44(local_108._0_4_,fVar13);
      local_f8 = (pointer)((ulong)(uint)fVar13 << 0x20);
      if (iStack_a0._M_current == local_98) {
        std::vector<std::pair<djb::vec3,djb::vec3>,std::allocator<std::pair<djb::vec3,djb::vec3>>>::
        _M_realloc_insert<std::pair<djb::vec3,djb::vec3>>
                  ((vector<std::pair<djb::vec3,djb::vec3>,std::allocator<std::pair<djb::vec3,djb::vec3>>>
                    *)&local_a8,iStack_a0,(pair<djb::vec3,_djb::vec3> *)local_108);
      }
      else {
        *(pointer *)&((iStack_a0._M_current)->second).y = local_f8;
        ((iStack_a0._M_current)->first).x = (float_t)local_108._0_4_;
        ((iStack_a0._M_current)->first).y = 0.0;
        *(pointer *)&((iStack_a0._M_current)->first).z = stack0xffffffffffffff00;
        iStack_a0._M_current = iStack_a0._M_current + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  local_88 = this;
  (*local_e0->_vptr_brdf[3])(&local_68,local_e0,&local_a8,0);
  local_f8 = local_c8.
             super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  unique0x10000908 =
       local_c8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_108._0_8_ =
       local_c8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_c8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_c8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_c8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)local_108);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector(&local_68);
  local_90 = (ulong)(uint)res;
  if (1 < res) {
    local_e4 = (float)(int)uVar10;
    local_78 = 3.1415927410125732 / (double)(int)uVar10;
    local_80 = (ulong)uVar10;
    uVar8 = 0;
    do {
      fVar12 = (float)(int)uVar8 / local_e4;
      fVar12 = fVar12 * fVar12 * 3.1415927 * 0.5;
      local_d0 = cosf(fVar12);
      local_d4 = sinf(fVar12);
      pvVar5 = local_c8.
               super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar1 = local_c8.
              super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8]._M_size;
      __n = uVar1 * 4;
      __dest = (float *)operator_new(__n);
      if (pvVar5[uVar8]._M_data != (float *)0x0) {
        memcpy(__dest,pvVar5[uVar8]._M_data,__n);
      }
      fVar12 = *__dest;
      if (uVar1 != 1) {
        lVar7 = 4;
        do {
          fVar12 = fVar12 + *(float *)((long)__dest + lVar7);
          lVar7 = lVar7 + 4;
        } while (__n - lVar7 != 0);
      }
      local_70 = (double)(fVar12 / (float)uVar1) * local_78;
      uVar11 = 0;
      do {
        fVar12 = (float)(int)uVar11 / local_e4;
        local_e0 = (brdf *)CONCAT44(local_e0._4_4_,fVar12);
        fVar13 = fVar12 * fVar12 * 3.1415927 * 0.5;
        fVar12 = cosf(fVar13);
        local_cc = sinf(fVar13);
        fVar13 = local_d4 * local_cc;
        fVar12 = fVar12 * local_d0;
        dVar4 = 0.0;
        iVar9 = 0;
        do {
          fVar14 = cosf(((float)iVar9 / 180.0 + (float)iVar9 / 180.0) * 3.1415927);
          fVar15 = fVar14 * fVar13 + fVar12;
          fVar14 = 0.0;
          if (0.0 <= fVar15) {
            fVar14 = fVar15;
          }
          fVar15 = 1.0;
          if (fVar14 <= 1.0) {
            fVar15 = fVar14;
          }
          dVar4 = dVar4 + (double)fVar15;
          iVar9 = iVar9 + 1;
        } while (iVar9 != 0xb4);
        local_50.mij.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[(int)(local_50.size * (int)uVar8 + uVar11)] =
             (double)(local_e0._0_4_ * local_cc) * dVar4 * 0.034906586011250816 * local_70;
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar10);
      operator_delete(__dest);
      uVar8 = uVar8 + 1;
    } while (uVar8 != local_80);
  }
  matrix::eigenvector((vector<double,_std::allocator<double>_> *)local_108,&local_50,4);
  ptVar6 = local_88;
  uVar8 = local_90;
  if (0 < (int)((ulong)((long)stack0xffffffffffffff00 - local_108._0_8_) >> 3)) {
    this_00 = &local_88->m_ndf;
    lVar7 = 0;
    do {
      local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_68.
                             super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             (float)(double)((size_t *)local_108._0_8_)[lVar7]);
      iVar2._M_current =
           (ptVar6->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ptVar6->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (this_00,iVar2,(float *)&local_68);
      }
      else {
        *iVar2._M_current = (float)(double)((size_t *)local_108._0_8_)[lVar7];
        (ptVar6->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)((ulong)((long)stack0xffffffffffffff00 - local_108._0_8_) >> 3));
  }
  pfVar3 = (ptVar6->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar12 = pfVar3[(long)(int)uVar8 + -2];
  fVar13 = (fVar12 + fVar12) - pfVar3[(long)(int)uVar8 + -3];
  fVar12 = 0.0;
  if (0.0 <= fVar13) {
    fVar12 = fVar13;
  }
  local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_68.
                         super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar12);
  iVar2._M_current =
       (ptVar6->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (ptVar6->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&ptVar6->m_ndf,iVar2,(float *)&local_68);
  }
  else {
    *iVar2._M_current = fVar12;
    (ptVar6->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  fwrite("djb_verbose: NDF extraction complete\n",0x25,1,_stdout);
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_);
  }
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector(&local_c8);
  if (local_a8 != (void *)0x0) {
    operator_delete(local_a8);
  }
  if (local_50.mij.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.mij.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void tab_r::extract_ndf(const brdf &brdf, int res)
{
	const int cnt = res - 1;
	const double du = (double)m_pi() / cnt;
	matrix km(cnt);
	std::vector<brdf::io_pair> io;
	std::vector<brdf::value_type> frp_v;

	// evaluate all directions
	for (int i = 0; i < cnt; ++i) {
		float_t u = (float_t)i / (float_t)cnt;
		float_t ti = sqr(u) * m_pi() / 2;
		float_t zi = cos(ti), z_i = sin(ti);
		vec3 wi = vec3(z_i, 0, zi);

		io.push_back(brdf::io_pair(wi, wi));
	}
	frp_v = brdf.eval_batch(io);

	// build kernel
	for (int i = 0; i < cnt; ++i) {
		float_t u = (float_t)i / cnt;
		float_t ti = sqr(u) * m_pi() / 2;
		float_t zi = cos(ti), z_i = sin(ti);
		brdf::value_type frp = frp_v[i];
		float_t frp_i = frp.sum() / frp.size();//dot(frp, vec3(0.2126, 0.7152, 0.0722));
		double kji_tmp = (double)frp_i * du;

		for (int j = 0; j < cnt; ++j) {
			const int nk = 180;
			const double dk = 2 * (double)m_pi() / nk;
			float_t u = (float_t)j / cnt;
			float_t tm = sqr(u) * m_pi() / 2;
			float_t zm = cos(tm), z_m = sin(tm);
			double nint = 0;

			for (int k = 0; k < nk; ++k) {
				float_t u = (float_t)k / (float_t)nk;
				float_t pm = u * 2 * m_pi();

				nint+= (double)sat(z_i * z_m * cos(pm) + zi * zm);
			}
			nint*= dk;

			km(j, i) = kji_tmp * nint * (double)(u * z_m);
		}
	}

	// compute
	const std::vector<double> v = km.eigenvector(4);
	for (int i = 0; i < (int)v.size(); ++i)
		m_ndf.push_back(v[i]);
	m_ndf.push_back(max((float_t)0, 2 * m_ndf[cnt - 1] - m_ndf[cnt - 2]));

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: NDF extraction complete\n");
#endif
}